

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessQueriesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Queries::ErrorsTest::testInvalidParameterName(ErrorsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  undefined4 *puVar8;
  Enum<int,_2UL> EVar9;
  Enum<int,_2UL> local_6a8;
  MessageBuilder local_698;
  GetNameFunc local_518;
  int local_510;
  Enum<int,_2UL> local_508;
  MessageBuilder local_4f8;
  GetNameFunc local_378;
  int local_370;
  Enum<int,_2UL> local_368;
  MessageBuilder local_358;
  GetNameFunc local_1d8;
  int local_1d0;
  Enum<int,_2UL> local_1c8;
  MessageBuilder local_1b8;
  int local_38;
  GLenum error;
  GLuint local_28;
  GLuint local_24;
  GLuint query;
  GLuint buffer;
  bool is_error;
  bool is_ok;
  long lStack_18;
  GLuint invalid_pname;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  buffer = 0;
  do {
    buffer = buffer + 1;
    bVar1 = isParameterName(this,buffer);
  } while (bVar1);
  query._3_1_ = 1;
  query._2_1_ = 0;
  local_24 = 0;
  local_28 = 0;
  (**(code **)(lStack_18 + 0x6c8))(1,&local_24);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glGenBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x37d);
  (**(code **)(lStack_18 + 0x40))(0x8c8e,local_24);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x380);
  (**(code **)(lStack_18 + 0x150))(0x8c8e,8,0,0x88ea);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glBindBuffers have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,899);
  (**(code **)(lStack_18 + 0x3d8))(0x8914,1,&local_28);
  dVar3 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar3,"glCreateQueries have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessQueriesTests.cpp"
                  ,0x387);
  (*this->m_pGetQueryBufferObjectiv)(local_28,local_24,buffer,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x500) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1b8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [81])
                        "glGetQueryBufferObjectiv called with invalid parameter name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_1d8 = EVar9.m_getName;
    local_1d0 = EVar9.m_value;
    local_1c8.m_getName = local_1d8;
    local_1c8.m_value = local_1d0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1c8);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [40])", however GL_INVALID_ENUM was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectuiv)(local_28,local_24,buffer,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x500) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_358,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_358,
                        (char (*) [82])
                        "glGetQueryBufferObjectuiv called with invalid parameter name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_378 = EVar9.m_getName;
    local_370 = EVar9.m_value;
    local_368.m_getName = local_378;
    local_368.m_value = local_370;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_368);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [40])", however GL_INVALID_ENUM was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_358);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjecti64v)(local_28,local_24,buffer,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x500) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_4f8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_4f8,
                        (char (*) [83])
                        "glGetQueryBufferObjecti64v called with invalid parameter name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_518 = EVar9.m_getName;
    local_510 = EVar9.m_value;
    local_508.m_getName = local_518;
    local_508.m_value = local_510;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_508);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [40])", however GL_INVALID_ENUM was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    query._3_1_ = 0;
  }
  (*this->m_pGetQueryBufferObjectui64v)(local_28,local_24,buffer,0);
  local_38 = (**(code **)(lStack_18 + 0x800))();
  if (local_38 != 0x500) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_698,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_698,
                        (char (*) [84])
                        "glGetQueryBufferObjectui64v called with invalid parameter name has generated error "
                       );
    EVar9 = glu::getErrorStr(local_38);
    local_6a8.m_getName = EVar9.m_getName;
    local_6a8.m_value = EVar9.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_6a8);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [40])", however GL_INVALID_ENUM was expected.");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_698);
    query._3_1_ = 0;
  }
  if (local_28 != 0) {
    (**(code **)(lStack_18 + 0x458))(1,&local_28);
  }
  if (local_24 != 0) {
    (**(code **)(lStack_18 + 0x438))(1,&local_24);
  }
  do {
    iVar2 = (**(code **)(lStack_18 + 0x800))();
  } while (iVar2 != 0);
  if ((query._2_1_ & 1) == 0) {
    return (bool)(query._3_1_ & 1);
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::testInvalidParameterName()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating invalid parameter name. */
	glw::GLuint invalid_pname = 0;

	while (isParameterName(++invalid_pname))
		;

	/* Default result. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test's objects. */
	glw::GLuint buffer = 0;
	glw::GLuint query  = 0;

	try
	{
		/* Creating buffer for the test. */
		gl.genBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers have failed");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(glw::GLint64), DE_NULL, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffers have failed");

		/* Create query object for the test. */
		gl.createQueries(s_targets[0], 1, &query);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateQueries have failed");

		/* Test query of invalid parameter name (integer version). */
		m_pGetQueryBufferObjectiv(query, buffer, invalid_pname, 0);

		glw::GLenum error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectiv called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid parameter name (unsigned integer version). */
		m_pGetQueryBufferObjectuiv(query, buffer, invalid_pname, 0);

		error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectuiv called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid parameter name (64-bit integer version). */
		m_pGetQueryBufferObjecti64v(query, buffer, invalid_pname, 0);

		error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjecti64v called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}

		/* Test query of invalid parameter name (64-bit unsigned integer version). */
		m_pGetQueryBufferObjectui64v(query, buffer, invalid_pname, 0);

		error = gl.getError();

		if (GL_INVALID_ENUM != error)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetQueryBufferObjectui64v called with invalid parameter name has generated error "
				<< glu::getErrorStr(error) << ", however GL_INVALID_ENUM was expected." << tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}
	catch (...)
	{
		is_error = true;
	}

	/* Releasing objects. */
	if (query)
	{
		gl.deleteQueries(1, &query);
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);
	}

	/* Error cleanup. */
	while (gl.getError())
		;

	if (is_error)
	{
		throw 0;
	}

	return is_ok;
}